

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

void __thiscall kws::Parser::GenerateFixedFile(Parser *this)

{
  _Alloc_hider _Var1;
  char cVar2;
  size_t sVar3;
  string filename;
  ofstream file;
  allocator local_259;
  string local_258;
  string local_238;
  undefined1 local_218 [16];
  char local_208 [232];
  ios_base local_120 [264];
  
  if (this->m_FixFile == true) {
    if ((this->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No error. Not generating corrected file.",0x28);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      return;
    }
    std::__cxx11::string::string
              ((string *)local_218,(this->m_Filename)._M_dataplus._M_p,(allocator *)&local_238);
    kwssys::SystemTools::GetFilenameWithoutExtension(&local_258,(string *)local_218);
    if ((char *)local_218._0_8_ != local_208) {
      operator_delete((void *)local_218._0_8_);
    }
    std::__cxx11::string::append((char *)&local_258);
    std::__cxx11::string::string
              ((string *)&local_238,(this->m_Filename)._M_dataplus._M_p,&local_259);
    kwssys::SystemTools::GetFilenameExtension((string *)local_218,&local_238);
    std::__cxx11::string::_M_append((char *)&local_258,local_218._0_8_);
    if ((char *)local_218._0_8_ != local_208) {
      operator_delete((void *)local_218._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Generating corrected file: ",0x1b);
    _Var1._M_p = local_258._M_dataplus._M_p;
    if (local_258._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
    }
    else {
      sVar3 = strlen(local_258._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var1._M_p,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::ofstream::ofstream(local_218);
    std::ofstream::open(local_218,(_Ios_Openmode)local_258._M_dataplus._M_p);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot open file for writing: ",0x1e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(this->m_FixedBuffer)._M_dataplus._M_p,
                 (this->m_FixedBuffer)._M_string_length);
      std::ofstream::close();
    }
    local_218._0_8_ = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18)) = _getpwnam;
    std::filebuf::~filebuf((filebuf *)(local_218 + 8));
    std::ios_base::~ios_base(local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Parser::GenerateFixedFile()
{
  if(!this->m_FixFile)
    {
    return;
    }

    if (m_ErrorList.empty()) {
      std::cout << "No error. Not generating corrected file." << std::endl;
      return;
    }

  std::string filename = kwssys::SystemTools::GetFilenameWithoutExtension(m_Filename.c_str());
  filename += ".fixed";
  filename += kwssys::SystemTools::GetFilenameExtension(m_Filename.c_str());

  std::cout << "Generating corrected file: " << filename.c_str() << std::endl;

  std::ofstream file;
  file.open(filename.c_str(), std::ios::binary | std::ios::out);
  if(!file.is_open())
    {
    std::cout << "Cannot open file for writing: " <<  std::endl;
    return;
    }

  file << this->m_FixedBuffer;

  file.close();
}